

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2PrintHandlers.cpp
# Opt level: O0

void __thiscall SAX2PrintHandlers::writeChars(SAX2PrintHandlers *this)

{
  XMLFormatter *in_RCX;
  XMLSize_t in_RDX;
  XMLByte *in_RSI;
  
  writeChars((SAX2PrintHandlers *)&this[-1].field_0x40a0,in_RSI,in_RDX,in_RCX);
  return;
}

Assistant:

void SAX2PrintHandlers::writeChars(const XMLByte* const toWrite,
                                   const XMLSize_t      count,
                                   XMLFormatter* const /* formatter */)
{
    // For this one, just dump them to the standard output
    // Surprisingly, Solaris was the only platform on which
    // required the char* cast to print out the string correctly.
    // Without the cast, it was printing the pointer value in hex.
    // Quite annoying, considering every other platform printed
    // the string with the explicit cast to char* below.
    std::cout.write((char *) toWrite, (int) count);
	std::cout.flush();
}